

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O2

Area * __thiscall SceneParser::parseArea(SceneParser *this)

{
  Material *m;
  int iVar1;
  Area *this_00;
  Vector3f sideTwo;
  Vector3f sideOne;
  Vector3f corner;
  char token [100];
  
  getToken(this,token);
  if (token._0_2_ != 0x7b) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x177,"Area *SceneParser::parseArea()");
  }
  getToken(this,token);
  iVar1 = bcmp(token,"corner",7);
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"corner\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x179,"Area *SceneParser::parseArea()");
  }
  readVector3f((SceneParser *)&corner);
  getToken(this,token);
  if (CONCAT62(token._2_6_,token._0_2_) != 0x656e4f65646973) {
    __assert_fail("!strcmp(token, \"sideOne\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x17c,"Area *SceneParser::parseArea()");
  }
  readVector3f((SceneParser *)&sideOne);
  getToken(this,token);
  if (CONCAT62(token._2_6_,token._0_2_) == 0x6f775465646973) {
    readVector3f((SceneParser *)&sideTwo);
    getToken(this,token);
    if (token._0_2_ != 0x7d) {
      __assert_fail("!strcmp(token, \"}\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                    ,0x182,"Area *SceneParser::parseArea()");
    }
    m = this->_current_material;
    if (m != (Material *)0x0) {
      this_00 = (Area *)operator_new(0x60);
      Area::Area(this_00,&corner,&sideOne,&sideTwo,m);
      return this_00;
    }
    __assert_fail("_current_material != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x183,"Area *SceneParser::parseArea()");
  }
  __assert_fail("!strcmp(token, \"sideTwo\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x17f,"Area *SceneParser::parseArea()");
}

Assistant:

Area *
SceneParser::parseArea() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "corner"));
    Vector3f corner = readVector3f();
    getToken(token);
    assert(!strcmp(token, "sideOne"));
    Vector3f sideOne = readVector3f();
    getToken(token);
    assert(!strcmp(token, "sideTwo"));
    Vector3f sideTwo = readVector3f();
    getToken(token);
    assert(!strcmp(token, "}"));
    assert(_current_material != NULL);
    return new Area(corner, sideOne, sideTwo, _current_material);
}